

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O2

void __thiscall chrono::ChSolverPMINRES::ArchiveOUT(ChSolverPMINRES *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChSolverPMINRES>(marchive);
  ChIterativeSolverVI::ArchiveOUT(&this->super_ChIterativeSolverVI,marchive);
  local_30._value = &this->grad_diffstep;
  local_30._name = "grad_diffstep";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->rel_tolerance;
  local_48._name = "rel_tolerance";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &(this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond;
  local_60._name = "m_use_precond";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChSolverPMINRES::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverPMINRES>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(grad_diffstep);
    marchive << CHNVP(rel_tolerance);
    marchive << CHNVP(m_use_precond);
}